

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void write_apu(Emulator *e,MaskedAddress addr,u8 value)

{
  u8 uVar1;
  byte bVar2;
  SweepDirection SVar3;
  ulong uVar4;
  uint uVar5;
  u8 uVar6;
  u16 uVar7;
  Bool BVar8;
  char *pcVar9;
  char *pcVar10;
  u8 uVar11;
  uint uVar12;
  Channel *pCVar13;
  int iVar14;
  undefined6 in_register_00000032;
  char *pcVar15;
  WaveVolume WVar16;
  ushort uVar17;
  bool bVar18;
  Address AStack_30;
  
  pcVar15 = (char *)CONCAT62(in_register_00000032,addr);
  if ((((e->config).log_apu_writes != FALSE) || ((e->state).apu.initialized == FALSE)) &&
     (uVar4 = (e->apu_log).write_count, uVar4 < 0x400)) {
    (e->apu_log).write_count = uVar4 + 1;
    (e->apu_log).writes[uVar4].addr = (u8)((ulong)pcVar15 & 0xffffffff);
    (e->apu_log).writes[uVar4].value = value;
  }
  uVar17 = (ushort)((ulong)pcVar15 & 0xffffffff);
  uVar4 = (ulong)addr;
  if ((e->state).apu.enabled == FALSE) {
    if ((e->state).is_cgb == FALSE) {
      if ((0x16 < uVar17) || ((0x410842U >> (addr & 0x1f) & 1) == 0)) goto LAB_0010898b;
    }
    else if (uVar17 != 0x16) {
LAB_0010898b:
      pcVar9 = "unknown";
      if (uVar17 < 0x17) {
        pcVar9 = *(char **)(get_apu_reg_string_s_strings + uVar4 * 8);
      }
      pcVar10 = "unknown";
      if (pcVar9 != (char *)0x0) {
        pcVar10 = pcVar9;
      }
      HOOK_write_apu_disabled_asb(e,pcVar15,uVar4,pcVar10,value);
      return;
    }
  }
  if ((e->state).apu.initialized != FALSE) {
    apu_synchronize(e);
  }
  pcVar9 = "unknown";
  if (uVar17 < 0x17) {
    pcVar9 = *(char **)(get_apu_reg_string_s_strings + uVar4 * 8);
  }
  pcVar10 = "unknown";
  if (pcVar9 != (char *)0x0) {
    pcVar10 = pcVar9;
  }
  HOOK_write_apu_asb(e,pcVar15,uVar4,pcVar10,value);
  if (0x16 < uVar17) {
    return;
  }
  switch((long)&switchD_0010891a::switchdataD_001171d0 +
         (long)(int)(&switchD_0010891a::switchdataD_001171d0)[uVar4]) {
  case 0x10891c:
    SVar3 = (e->state).apu.sweep.direction;
    (e->state).apu.sweep.period = value >> 4 & 7;
    (e->state).apu.sweep.direction = value >> 3 & SWEEP_DIRECTION_SUBTRACTION;
    (e->state).apu.sweep.shift = value & 7;
    if ((((value >> 3 & 1) == 0) && (SVar3 == SWEEP_DIRECTION_SUBTRACTION)) &&
       ((e->state).apu.sweep.calculated_subtract != FALSE)) {
      (e->state).apu.channel[0].status = FALSE;
    }
    break;
  case 0x1089de:
    (e->state).apu.so_output[4][1] = (uint)(value >> 7);
    (e->state).apu.so_volume[1] = value >> 4 & 7;
    (e->state).apu.so_output[4][0] = value >> 3 & TRUE;
    (e->state).apu.so_volume[0] = value & 7;
    break;
  case 0x108a16:
    pCVar13 = (e->state).apu.channel + 2;
    BVar8 = write_nrx4_reg(e,pCVar13,0xe,value,0x100);
    write_wave_period(e,pCVar13);
    if (BVar8 != FALSE) {
      if ((((e->state).is_cgb == FALSE) && ((e->state).apu.wave.playing != FALSE)) &&
         ((e->state).apu.wave.ticks == 2)) {
        bVar2 = (e->state).apu.wave.position;
        if (0x1f < bVar2) {
          __assert_fail("WAVE.position < 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                        ,0xc53,"void write_apu(Emulator *, MaskedAddress, u8)");
        }
        uVar12 = bVar2 + 1 & 0x1f;
        uVar5 = uVar12 >> 1;
        if ((byte)uVar12 < 8) {
          (e->state).apu.wave.ram[0] = (e->state).apu.wave.ram[uVar5];
        }
        else {
          *(undefined4 *)(e->state).apu.wave.ram =
               *(undefined4 *)((e->state).apu.wave.ram + (uVar5 & 0xfffffffc));
        }
        HOOK_corrupt_wave_ram_i(e,(char *)pCVar13);
      }
      (e->state).apu.wave.position = '\0';
      (e->state).apu.wave.ticks = (e->state).apu.wave.period + 6;
      (e->state).apu.wave.playing = TRUE;
    }
    break;
  case 0x108a7b:
    (e->state).apu.channel[2].length = 0x100 - value;
    break;
  case 0x108a8f:
    *(u8 *)&(e->state).apu.channel[2].frequency = value;
    write_wave_period(e,(e->state).apu.channel + 2);
    return;
  case 0x108aad:
    (e->state).apu.so_output[3][1] = (uint)(value >> 7);
    (e->state).apu.so_output[2][1] = value >> 6 & TRUE;
    (e->state).apu.so_output[1][1] = value >> 5 & TRUE;
    (e->state).apu.so_output[0][1] = value >> 4 & TRUE;
    (e->state).apu.so_output[3][0] = value >> 3 & TRUE;
    (e->state).apu.so_output[2][0] = value >> 2 & TRUE;
    (e->state).apu.so_output[1][0] = value >> 1 & TRUE;
    (e->state).apu.so_output[0][0] = value & TRUE;
    break;
  case 0x108b22:
    pCVar13 = (e->state).apu.channel;
    AStack_30 = 2;
    goto LAB_00108ba9;
  case 0x108b2d:
    pCVar13 = (e->state).apu.channel + 1;
    AStack_30 = 6;
    goto LAB_00108b8c;
  case 0x108b38:
    WVar16 = value >> 5 & WAVE_VOLUME_25;
    (e->state).apu.wave.volume = WVar16;
    (e->state).apu.wave.volume_shift = "\x04"[WVar16];
    break;
  case 0x108b5d:
    pCVar13 = (e->state).apu.channel;
    AStack_30 = 1;
    goto LAB_00108b8c;
  case 0x108b68:
    pCVar13 = (e->state).apu.channel + 1;
    AStack_30 = 7;
    goto LAB_00108ba9;
  case 0x108b73:
    pCVar13 = (e->state).apu.channel + 1;
    *(u8 *)&(e->state).apu.channel[1].frequency = value;
LAB_00108bcb:
    write_square_wave_period(e,pCVar13,&pCVar13->square_wave);
    return;
  case 0x108b83:
    pCVar13 = (e->state).apu.channel + 3;
    AStack_30 = 0x10;
LAB_00108b8c:
    write_nrx1_reg(e,pCVar13,AStack_30,value);
    return;
  case 0x108ba0:
    pCVar13 = (e->state).apu.channel + 3;
    AStack_30 = 0x11;
LAB_00108ba9:
    write_nrx2_reg(e,pCVar13,AStack_30,value);
    return;
  case 0x108bbd:
    pCVar13 = (e->state).apu.channel;
    *(u8 *)&(e->state).apu.channel[0].frequency = value;
    goto LAB_00108bcb;
  case 0x108bde:
    pCVar13 = (e->state).apu.channel;
    BVar8 = write_nrx4_reg(e,pCVar13,4,value,0x40);
    write_square_wave_period(e,pCVar13,&pCVar13->square_wave);
    if (BVar8 == FALSE) {
      return;
    }
    trigger_nrx4_envelope(e,&(e->state).apu.channel[0].envelope,4);
    uVar6 = (u8)*(undefined4 *)&(e->state).apu.sweep;
    uVar1 = (e->state).apu.sweep.shift;
    uVar11 = '\b';
    if (uVar6 != '\0') {
      uVar11 = uVar6;
    }
    bVar18 = uVar1 != '\0' || uVar6 != '\0';
    pcVar15 = (char *)(ulong)bVar18;
    (e->state).apu.sweep.enabled = (uint)bVar18;
    uVar17 = (e->state).apu.channel[0].frequency;
    (e->state).apu.sweep.frequency = uVar17;
    (e->state).apu.sweep.timer = uVar11;
    (e->state).apu.sweep.calculated_subtract = FALSE;
    if (uVar1 == '\0') {
LAB_00108c81:
      HOOK_trigger_nr14_info_i(e,pcVar15,(ulong)uVar17);
    }
    else {
      uVar7 = calculate_sweep_frequency(e);
      if (uVar7 < 0x800) {
        uVar17 = (e->state).apu.sweep.frequency;
        goto LAB_00108c81;
      }
      (e->state).apu.channel[0].status = FALSE;
      HOOK_trigger_nr14_sweep_overflow_v(e,pcVar15);
    }
    (e->state).apu.channel[0].square_wave.ticks = (e->state).apu.channel[0].square_wave.period;
    break;
  case 0x108c9f:
    (e->state).apu.channel[2].dac_enabled = (uint)(value >> 7);
    if (-1 < (char)value) {
      (e->state).apu.channel[2].status = FALSE;
      (e->state).apu.wave.playing = FALSE;
    }
    break;
  case 0x108cc6:
    pCVar13 = (e->state).apu.channel + 1;
    BVar8 = write_nrx4_reg(e,pCVar13,9,value,0x40);
    write_square_wave_period(e,pCVar13,&pCVar13->square_wave);
    if (BVar8 != FALSE) {
      trigger_nrx4_envelope(e,&(e->state).apu.channel[1].envelope,9);
      (e->state).apu.channel[1].square_wave.ticks = (e->state).apu.channel[1].square_wave.period;
    }
    break;
  case 0x108d1d:
    BVar8 = write_nrx4_reg(e,(e->state).apu.channel + 3,0x13,value,0x40);
    if (BVar8 != FALSE) {
      write_noise_period(e);
      trigger_nrx4_envelope(e,&(e->state).apu.channel[3].envelope,0x13);
      (e->state).apu.noise.lfsr = 0x7fff;
      (e->state).apu.noise.sample = '\x01';
      (e->state).apu.noise.ticks = (e->state).apu.noise.period;
    }
    break;
  case 0x108d76:
    (e->state).apu.noise.clock_shift = value >> 4;
    (e->state).apu.noise.lfsr_width = value >> 3 & LFSR_WIDTH_7;
    (e->state).apu.noise.divisor = value & 7;
    write_noise_period(e);
    return;
  case 0x108dab:
    BVar8 = (e->state).apu.enabled;
    if (-1 < (char)value && BVar8 != FALSE) {
      iVar14 = 0;
      HOOK_apu_power_down_v(e,pcVar15);
      do {
        if (iVar14 != 0x16) {
          if (iVar14 == 0x17) goto LAB_00108de4;
          write_apu(e,(MaskedAddress)iVar14,'\0');
        }
        iVar14 = iVar14 + 1;
      } while( true );
    }
    if (BVar8 == FALSE && (char)value < '\0') {
      HOOK_apu_power_up_v(e,pcVar15);
      (e->state).apu.frame = '\a';
    }
LAB_00108de4:
    (e->state).apu.enabled = (uint)(value >> 7);
  }
  return;
}

Assistant:

static void write_apu(Emulator* e, MaskedAddress addr, u8 value) {
  if (e->config.log_apu_writes || !APU.initialized) {
    if (e->apu_log.write_count < MAX_APU_LOG_FRAME_WRITES) {
      ApuWrite* write = &e->apu_log.writes[e->apu_log.write_count++];
      write->addr = addr;
      write->value = value;
    }
  }

  if (!APU.enabled) {
    if (!IS_CGB && (addr == APU_NR11_ADDR || addr == APU_NR21_ADDR ||
                    addr == APU_NR31_ADDR || addr == APU_NR41_ADDR)) {
      /* DMG allows writes to the length counters when power is disabled. */
    } else if (addr == APU_NR52_ADDR) {
      /* Always can write to NR52; it's necessary to re-enable power to APU. */
    } else {
      /* Ignore all other writes. */
      HOOK(write_apu_disabled_asb, addr, get_apu_reg_string(addr), value);
      return;
    }
  }

  if (APU.initialized) {
    apu_synchronize(e);
  }

  HOOK(write_apu_asb, addr, get_apu_reg_string(addr), value);
  switch (addr) {
    case APU_NR10_ADDR: {
      SweepDirection old_direction = SWEEP.direction;
      SWEEP.period = UNPACK(value, NR10_SWEEP_PERIOD);
      SWEEP.direction = UNPACK(value, NR10_SWEEP_DIRECTION);
      SWEEP.shift = UNPACK(value, NR10_SWEEP_SHIFT);
      if (old_direction == SWEEP_DIRECTION_SUBTRACTION &&
          SWEEP.direction == SWEEP_DIRECTION_ADDITION &&
          SWEEP.calculated_subtract) {
        CHANNEL1.status = FALSE;
      }
      break;
    }
    case APU_NR11_ADDR:
      write_nrx1_reg(e, &CHANNEL1, addr, value);
      break;
    case APU_NR12_ADDR:
      write_nrx2_reg(e, &CHANNEL1, addr, value);
      break;
    case APU_NR13_ADDR:
      write_nrx3_reg(e, &CHANNEL1, value);
      write_square_wave_period(e, &CHANNEL1, &CHANNEL1.square_wave);
      break;
    case APU_NR14_ADDR: {
      Bool trigger = write_nrx4_reg(e, &CHANNEL1, addr, value, NRX1_MAX_LENGTH);
      write_square_wave_period(e, &CHANNEL1, &CHANNEL1.square_wave);
      if (trigger) {
        trigger_nrx4_envelope(e, &CHANNEL1.envelope, addr);
        trigger_nr14_reg(e, &CHANNEL1);
        CHANNEL1.square_wave.ticks = CHANNEL1.square_wave.period;
      }
      break;
    }
    case APU_NR21_ADDR:
      write_nrx1_reg(e, &CHANNEL2, addr, value);
      break;
    case APU_NR22_ADDR:
      write_nrx2_reg(e, &CHANNEL2, addr, value);
      break;
    case APU_NR23_ADDR:
      write_nrx3_reg(e, &CHANNEL2, value);
      write_square_wave_period(e, &CHANNEL2, &CHANNEL2.square_wave);
      break;
    case APU_NR24_ADDR: {
      Bool trigger = write_nrx4_reg(e, &CHANNEL2, addr, value, NRX1_MAX_LENGTH);
      write_square_wave_period(e, &CHANNEL2, &CHANNEL2.square_wave);
      if (trigger) {
        trigger_nrx4_envelope(e, &CHANNEL2.envelope, addr);
        CHANNEL2.square_wave.ticks = CHANNEL2.square_wave.period;
      }
      break;
    }
    case APU_NR30_ADDR:
      CHANNEL3.dac_enabled = UNPACK(value, NR30_DAC_ENABLED);
      if (!CHANNEL3.dac_enabled) {
        CHANNEL3.status = FALSE;
        WAVE.playing = FALSE;
      }
      break;
    case APU_NR31_ADDR:
      CHANNEL3.length = NR31_MAX_LENGTH - value;
      break;
    case APU_NR32_ADDR:
      WAVE.volume = UNPACK(value, NR32_SELECT_WAVE_VOLUME);
      assert(WAVE.volume < WAVE_VOLUME_COUNT);
      WAVE.volume_shift = s_wave_volume_shift[WAVE.volume];
      break;
    case APU_NR33_ADDR:
      write_nrx3_reg(e, &CHANNEL3, value);
      write_wave_period(e, &CHANNEL3);
      break;
    case APU_NR34_ADDR: {
      Bool trigger = write_nrx4_reg(e, &CHANNEL3, addr, value, NR31_MAX_LENGTH);
      write_wave_period(e, &CHANNEL3);
      if (trigger) {
        if (!IS_CGB && WAVE.playing) {
          /* Triggering the wave channel while it is already playing will
           * corrupt the wave RAM on DMG. */
          if (WAVE.ticks == WAVE_TRIGGER_CORRUPTION_OFFSET_TICKS) {
            assert(WAVE.position < 32);
            u8 position = (WAVE.position + 1) & 31;
            u8 byte = WAVE.ram[position >> 1];
            switch (position >> 3) {
              case 0:
                WAVE.ram[0] = byte;
                break;
              case 1:
              case 2:
              case 3:
                memcpy(&WAVE.ram[0], &WAVE.ram[(position >> 1) & 12], 4);
                break;
            }
            HOOK(corrupt_wave_ram_i, position);
          }
        }

        WAVE.position = 0;
        WAVE.ticks = WAVE.period + WAVE_TRIGGER_DELAY_TICKS;
        WAVE.playing = TRUE;
      }
      break;
    }
    case APU_NR41_ADDR:
      write_nrx1_reg(e, &CHANNEL4, addr, value);
      break;
    case APU_NR42_ADDR:
      write_nrx2_reg(e, &CHANNEL4, addr, value);
      break;
    case APU_NR43_ADDR: {
      NOISE.clock_shift = UNPACK(value, NR43_CLOCK_SHIFT);
      NOISE.lfsr_width = UNPACK(value, NR43_LFSR_WIDTH);
      NOISE.divisor = UNPACK(value, NR43_DIVISOR);
      write_noise_period(e);
      break;
    }
    case APU_NR44_ADDR: {
      Bool trigger = write_nrx4_reg(e, &CHANNEL4, addr, value, NRX1_MAX_LENGTH);
      if (trigger) {
        write_noise_period(e);
        trigger_nrx4_envelope(e, &CHANNEL4.envelope, addr);
        NOISE.lfsr = 0x7fff;
        NOISE.sample = 1;
        NOISE.ticks = NOISE.period;
      }
      break;
    }
    case APU_NR50_ADDR:
      APU.so_output[VIN][1] = UNPACK(value, NR50_VIN_SO2);
      APU.so_volume[1] = UNPACK(value, NR50_SO2_VOLUME);
      APU.so_output[VIN][0] = UNPACK(value, NR50_VIN_SO1);
      APU.so_volume[0] = UNPACK(value, NR50_SO1_VOLUME);
      break;
    case APU_NR51_ADDR:
      APU.so_output[SOUND4][1] = UNPACK(value, NR51_SOUND4_SO2);
      APU.so_output[SOUND3][1] = UNPACK(value, NR51_SOUND3_SO2);
      APU.so_output[SOUND2][1] = UNPACK(value, NR51_SOUND2_SO2);
      APU.so_output[SOUND1][1] = UNPACK(value, NR51_SOUND1_SO2);
      APU.so_output[SOUND4][0] = UNPACK(value, NR51_SOUND4_SO1);
      APU.so_output[SOUND3][0] = UNPACK(value, NR51_SOUND3_SO1);
      APU.so_output[SOUND2][0] = UNPACK(value, NR51_SOUND2_SO1);
      APU.so_output[SOUND1][0] = UNPACK(value, NR51_SOUND1_SO1);
      break;
    case APU_NR52_ADDR: {
      Bool was_enabled = APU.enabled;
      Bool is_enabled = UNPACK(value, NR52_ALL_SOUND_ENABLED);
      if (was_enabled && !is_enabled) {
        HOOK0(apu_power_down_v);
        int i;
        for (i = 0; i < APU_REG_COUNT; ++i) {
          if (i != APU_NR52_ADDR) {
            write_apu(e, i, 0);
          }
        }
      } else if (!was_enabled && is_enabled) {
        HOOK0(apu_power_up_v);
        APU.frame = 7;
      }
      APU.enabled = is_enabled;
      break;
    }
  }
}